

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

optional<tinyusdz::Animatable<std::array<float,_2UL>_>_> * __thiscall
tinyusdz::prim::(anonymous_namespace)::ConvertToAnimatable<std::array<float,2ul>>
          (optional<tinyusdz::Animatable<std::array<float,_2UL>_>_> *__return_storage_ptr__,
          _anonymous_namespace_ *this,PrimVar *var)

{
  undefined1 uVar1;
  pointer pSVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  TimeSamples *this_00;
  long lVar6;
  ulong uVar7;
  optional<std::array<float,_2UL>_> pv;
  Animatable<std::array<float,_2UL>_> dst;
  optional<std::array<float,_2UL>_> local_94;
  optional<tinyusdz::Animatable<std::array<float,_2UL>_>_> *local_88;
  storage_t<std::array<float,_2UL>_> local_80;
  undefined2 local_78;
  TypedTimeSamples<std::array<float,_2UL>_> local_70;
  storage_t<tinyusdz::Animatable<std::array<float,_2UL>_>_> *local_50;
  TimeSamples *local_48;
  optional<std::array<float,_2UL>_> local_3c;
  
  local_80 = (storage_t<std::array<float,_2UL>_>)0x0;
  local_78 = 0;
  local_70._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_70._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_70._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_70._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  local_70._dirty = false;
  bVar3 = primvar::PrimVar::is_valid((PrimVar *)this);
  if (bVar3) {
    if ((this[0x18] == (_anonymous_namespace_)0x0) &&
       (((*(undefined8 **)(this + 0x10) != (undefined8 *)0x0 &&
         (iVar5 = (*(code *)**(undefined8 **)(this + 0x10))(), iVar5 == 0)) ||
        ((*(undefined8 **)(this + 0x10) != (undefined8 *)0x0 &&
         (iVar5 = (*(code *)**(undefined8 **)(this + 0x10))(), iVar5 == 1)))))) {
      cVar4 = '\0';
    }
    else {
      primvar::PrimVar::get_value<std::array<float,2ul>>(&local_94,(PrimVar *)this);
      cVar4 = local_94.has_value_;
      if (local_94.has_value_ == true) {
        local_80 = local_94.contained;
        local_78 = 1;
      }
    }
    if (*(long *)(this + 0x28) == *(long *)(this + 0x20)) {
      if (cVar4 == '\0') goto LAB_00251155;
    }
    else {
      uVar1 = __return_storage_ptr__->has_value_;
      local_88 = __return_storage_ptr__;
      if (*(long *)(this + 0x28) != *(long *)(this + 0x20)) {
        this_00 = (TimeSamples *)(this + 0x20);
        local_50 = &__return_storage_ptr__->contained;
        lVar6 = 0;
        uVar7 = 0;
        local_48 = this_00;
        do {
          if (this[0x38] == (_anonymous_namespace_)0x1) {
            tinyusdz::value::TimeSamples::update(this_00);
          }
          pSVar2 = (this_00->_samples).
                   super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((&pSVar2->blocked)[lVar6] == true) {
            TypedTimeSamples<std::array<float,_2UL>_>::add_blocked_sample
                      (&local_70,*(double *)((long)&pSVar2->t + lVar6));
          }
          else {
            tinyusdz::value::Value::get_value<std::array<float,2ul>>
                      (&local_3c,(Value *)((long)&(pSVar2->value).v_ + lVar6),false);
            bVar3 = local_3c.has_value_;
            local_94.has_value_ = local_3c.has_value_;
            if (local_3c.has_value_ == true) {
              local_94.contained = local_3c.contained;
              TypedTimeSamples<std::array<float,_2UL>_>::add_sample
                        (&local_70,*(double *)((long)&pSVar2->t + lVar6),
                         (array<float,_2UL> *)&local_94.contained);
            }
            else {
              *(undefined8 *)((long)local_50 + 0x20) = 0;
              *(undefined8 *)((long)local_50 + 0x28) = 0;
              *(undefined8 *)((long)local_50 + 0x10) = 0;
              *(undefined8 *)((long)local_50 + 0x18) = 0;
              *(undefined8 *)local_50 = 0;
              *(undefined8 *)((long)local_50 + 8) = 0;
              uVar1 = false;
            }
            this_00 = local_48;
            if (bVar3 == false) {
              local_88->has_value_ = (bool)uVar1;
              __return_storage_ptr__ = local_88;
              goto LAB_00251167;
            }
          }
          uVar7 = uVar7 + 1;
          lVar6 = lVar6 + 0x28;
        } while (uVar7 < (ulong)((*(long *)(this + 0x28) - *(long *)(this + 0x20) >> 3) *
                                -0x3333333333333333));
      }
      local_88->has_value_ = (bool)uVar1;
      __return_storage_ptr__ = local_88;
    }
    __return_storage_ptr__->has_value_ = true;
    *(storage_t<std::array<float,_2UL>_> *)&__return_storage_ptr__->contained = local_80;
    *(undefined2 *)((long)&__return_storage_ptr__->contained + 8) = local_78;
    *(pointer *)((long)&__return_storage_ptr__->contained + 0x10) =
         local_70._samples.
         super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(ulong *)((long)&__return_storage_ptr__->contained + 0x18) =
         CONCAT71(local_70._samples.
                  super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                  local_70._samples.
                  super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_finish._0_1_);
    *(ulong *)((long)&__return_storage_ptr__->contained + 0x20) =
         CONCAT71(local_70._samples.
                  super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                  local_70._samples.
                  super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_);
    local_70._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_70._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_70._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    local_70._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_70._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
    *(bool *)((long)&__return_storage_ptr__->contained + 0x28) = local_70._dirty;
  }
  else {
LAB_00251155:
    __return_storage_ptr__->has_value_ = false;
    *(undefined8 *)&__return_storage_ptr__->contained = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x28) = 0;
  }
LAB_00251167:
  if (local_70._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70._samples.
                    super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    CONCAT71(local_70._samples.
                             super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_70._samples.
                             super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) -
                    (long)local_70._samples.
                          super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

static nonstd::optional<Animatable<T>> ConvertToAnimatable(const primvar::PrimVar &var)
{
  Animatable<T> dst;

  if (!var.is_valid()) {
    DCOUT("is_valid failed");
    DCOUT("has_value " << var.has_value());
    DCOUT("has_timesamples " << var.has_timesamples());
    return nonstd::nullopt;
  }

  bool ok = false;

  if (var.has_value()) {

    if (auto pv = var.get_value<T>()) {
      dst.set_default(pv.value());

      ok = true;
      //return std::move(dst);
    }
  }

  if (var.has_timesamples()) {
    for (size_t i = 0; i < var.ts_raw().size(); i++) {
      const value::TimeSamples::Sample &s = var.ts_raw().get_samples()[i];

      // Attribute Block?
      if (s.blocked) {
        dst.add_blocked_sample(s.t);
      } else if (auto pv = s.value.get_value<T>()) {
        dst.add_sample(s.t, pv.value());
      } else {
        // Type mismatch
        DCOUT(i << "/" << var.ts_raw().size() << " type mismatch.");
        return nonstd::nullopt;
      }
    }

    ok = true;
  }

  if (ok) {
    return std::move(dst);
  }

  DCOUT("???");
  return nonstd::nullopt;
}